

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SSLTest_AddClientCA_Test::TestBody(SSLTest_AddClientCA_Test *this)

{
  bool bVar1;
  SSL_METHOD *meth;
  pointer psVar2;
  char *pcVar3;
  SSL *pSVar4;
  X509 *pXVar5;
  X509_NAME *b;
  stack_st_X509_NAME *sk;
  X509_NAME *pXVar6;
  char *in_R9;
  bool local_371;
  AssertHelper local_358;
  Message local_350;
  int local_348 [2];
  undefined1 local_340 [8];
  AssertionResult gtest_ar_7;
  Message local_328;
  int local_320 [2];
  undefined1 local_318 [8];
  AssertionResult gtest_ar_6;
  Message local_300;
  int local_2f8 [2];
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar_5;
  Message local_2d8;
  size_t local_2d0;
  uint local_2c4;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_290;
  Message local_288;
  int local_27c;
  undefined1 local_278 [8];
  AssertionResult gtest_ar__5;
  Message local_260;
  int local_258 [2];
  undefined1 local_250 [8];
  AssertionResult gtest_ar_3;
  Message local_238;
  int local_230 [2];
  undefined1 local_228 [8];
  AssertionResult gtest_ar_2;
  Message local_210;
  size_t local_208;
  uint local_1fc;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar_1;
  stack_st_X509_NAME *list;
  AssertHelper local_1c0;
  Message local_1b8;
  int local_1ac;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_178;
  Message local_170;
  int local_164;
  undefined1 local_160 [8];
  AssertionResult gtest_ar__3;
  Message local_148;
  size_t local_140;
  uint local_134;
  undefined1 local_130 [8];
  AssertionResult gtest_ar;
  X509_NAME *name2;
  X509_NAME *name1;
  AssertHelper local_f0;
  Message local_e8;
  bool local_d9;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar__2;
  UniquePtr<X509> cert2;
  UniquePtr<X509> cert1;
  AssertHelper local_98;
  Message local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar__1;
  UniquePtr<SSL> ssl;
  string local_68;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  UniquePtr<SSL_CTX> ctx;
  SSLTest_AddClientCA_Test *this_local;
  
  meth = (SSL_METHOD *)TLS_method();
  psVar2 = (pointer)SSL_CTX_new(meth);
  std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ssl_ctx_st,bssl::internal::Deleter> *)&gtest_ar_.message_,psVar2);
  testing::AssertionResult::AssertionResult<std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_28,
             (unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_28,(AssertionResult *)0x4d86cd,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x6e2,pcVar3);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (bVar1) {
    psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
    pSVar4 = SSL_new((SSL_CTX *)psVar2);
    std::unique_ptr<ssl_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<ssl_st,bssl::internal::Deleter> *)&gtest_ar__1.message_,(pointer)pSVar4);
    testing::AssertionResult::AssertionResult<std::unique_ptr<ssl_st,bssl::internal::Deleter>>
              ((AssertionResult *)local_88,
               (unique_ptr<ssl_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
    if (!bVar1) {
      testing::Message::Message(&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&cert1,(internal *)local_88,(AssertionResult *)0x4e465b,"false","true",
                 in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x6e4,pcVar3);
      testing::internal::AssertHelper::operator=(&local_98,&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      std::__cxx11::string::~string((string *)&cert1);
      testing::Message::~Message(&local_90);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
    if (bVar1) {
      GetTestCertificate();
      GetChainTestCertificate();
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&cert2);
      local_371 = false;
      if (bVar1) {
        local_371 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&gtest_ar__2.message_);
      }
      local_d9 = local_371;
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_d8,&local_d9,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
      if (!bVar1) {
        testing::Message::Message(&local_e8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&name1,(internal *)local_d8,(AssertionResult *)"cert1 && cert2","false"
                   ,"true",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_f0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x6e8,pcVar3);
        testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
        testing::internal::AssertHelper::~AssertHelper(&local_f0);
        std::__cxx11::string::~string((string *)&name1);
        testing::Message::~Message(&local_e8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
      if (bVar1) {
        pXVar5 = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&cert2);
        b = X509_get_subject_name(pXVar5);
        pXVar5 = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                    &gtest_ar__2.message_);
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )X509_get_subject_name(pXVar5);
        local_134 = 0;
        pSVar4 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                  ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)
                                   &gtest_ar__1.message_);
        sk = (stack_st_X509_NAME *)SSL_get_client_CA_list(pSVar4);
        local_140 = sk_X509_NAME_num(sk);
        testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
                  ((EqHelper *)local_130,"0u","sk_X509_NAME_num(SSL_get_client_CA_list(ssl.get()))",
                   &local_134,&local_140);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
        if (!bVar1) {
          testing::Message::Message(&local_148);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__3.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x6ec,pcVar3);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__3.message_,&local_148);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3.message_);
          testing::Message::~Message(&local_148);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
        pSVar4 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                  ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)
                                   &gtest_ar__1.message_);
        pXVar5 = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&cert2);
        local_164 = SSL_add_client_CA(pSVar4,pXVar5);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_160,&local_164,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
        if (!bVar1) {
          testing::Message::Message(&local_170);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__4.message_,(internal *)local_160,
                     (AssertionResult *)"SSL_add_client_CA(ssl.get(), cert1.get())","false","true",
                     in_R9);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_178,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x6ee,pcVar3);
          testing::internal::AssertHelper::operator=(&local_178,&local_170);
          testing::internal::AssertHelper::~AssertHelper(&local_178);
          std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
          testing::Message::~Message(&local_170);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
        if (bVar1) {
          pSVar4 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                    ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)
                                     &gtest_ar__1.message_);
          pXVar5 = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                     ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                      &gtest_ar__2.message_);
          local_1ac = SSL_add_client_CA(pSVar4,pXVar5);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_1a8,&local_1ac,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
          if (!bVar1) {
            testing::Message::Message(&local_1b8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&list,(internal *)local_1a8,
                       (AssertionResult *)"SSL_add_client_CA(ssl.get(), cert2.get())","false","true"
                       ,in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_1c0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x6ef,pcVar3);
            testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
            testing::internal::AssertHelper::~AssertHelper(&local_1c0);
            std::__cxx11::string::~string((string *)&list);
            testing::Message::~Message(&local_1b8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
          if (bVar1) {
            pSVar4 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                      ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)
                                       &gtest_ar__1.message_);
            gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )SSL_get_client_CA_list(pSVar4);
            local_1fc = 2;
            local_208 = sk_X509_NAME_num((stack_st_X509_NAME *)
                                         gtest_ar_1.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl);
            testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
                      ((EqHelper *)local_1f8,"2u","sk_X509_NAME_num(list)",&local_1fc,&local_208);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
            if (!bVar1) {
              testing::Message::Message(&local_210);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x6f2,pcVar3);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_2.message_,&local_210);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
              testing::Message::~Message(&local_210);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
            if (bVar1) {
              local_230[1] = 0;
              pXVar6 = sk_X509_NAME_value((stack_st_X509_NAME *)
                                          gtest_ar_1.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl,0);
              local_230[0] = X509_NAME_cmp((X509_NAME *)pXVar6,b);
              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                        ((EqHelper *)local_228,"0",
                         "X509_NAME_cmp(sk_X509_NAME_value(list, 0), name1)",local_230 + 1,local_230
                        );
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
              if (!bVar1) {
                testing::Message::Message(&local_238);
                pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_228);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x6f3,pcVar3);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_3.message_,&local_238);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_)
                ;
                testing::Message::~Message(&local_238);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
              local_258[1] = 0;
              pXVar6 = sk_X509_NAME_value((stack_st_X509_NAME *)
                                          gtest_ar_1.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl,1);
              local_258[0] = X509_NAME_cmp((X509_NAME *)pXVar6,
                                           (X509_NAME *)
                                           gtest_ar.message_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl);
              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                        ((EqHelper *)local_250,"0",
                         "X509_NAME_cmp(sk_X509_NAME_value(list, 1), name2)",local_258 + 1,local_258
                        );
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
              if (!bVar1) {
                testing::Message::Message(&local_260);
                pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_250);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar__5.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x6f4,pcVar3);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar__5.message_,&local_260);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&gtest_ar__5.message_);
                testing::Message::~Message(&local_260);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
              pSVar4 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                        ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)
                                         &gtest_ar__1.message_);
              pXVar5 = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&cert2);
              local_27c = SSL_add_client_CA(pSVar4,pXVar5);
              testing::AssertionResult::AssertionResult<int>
                        ((AssertionResult *)local_278,&local_27c,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
              if (!bVar1) {
                testing::Message::Message(&local_288);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_4.message_,(internal *)local_278,
                           (AssertionResult *)"SSL_add_client_CA(ssl.get(), cert1.get())","false",
                           "true",in_R9);
                pcVar3 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_290,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x6f6,pcVar3);
                testing::internal::AssertHelper::operator=(&local_290,&local_288);
                testing::internal::AssertHelper::~AssertHelper(&local_290);
                std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
                testing::Message::~Message(&local_288);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
              if (bVar1) {
                pSVar4 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                          ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)
                                           &gtest_ar__1.message_);
                gtest_ar_1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )SSL_get_client_CA_list(pSVar4);
                local_2c4 = 3;
                local_2d0 = sk_X509_NAME_num((stack_st_X509_NAME *)
                                             gtest_ar_1.message_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl);
                testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
                          ((EqHelper *)local_2c0,"3u","sk_X509_NAME_num(list)",&local_2c4,&local_2d0
                          );
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_2c0);
                if (!bVar1) {
                  testing::Message::Message(&local_2d8);
                  pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2c0);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x6f9,pcVar3);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_5.message_,&local_2d8);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_5.message_);
                  testing::Message::~Message(&local_2d8);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
                if (bVar1) {
                  local_2f8[1] = 0;
                  pXVar6 = sk_X509_NAME_value((stack_st_X509_NAME *)
                                              gtest_ar_1.message_._M_t.
                                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                              ._M_head_impl,0);
                  local_2f8[0] = X509_NAME_cmp((X509_NAME *)pXVar6,b);
                  testing::internal::EqHelper::Compare<int,_int,_nullptr>
                            ((EqHelper *)local_2f0,"0",
                             "X509_NAME_cmp(sk_X509_NAME_value(list, 0), name1)",local_2f8 + 1,
                             local_2f8);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_2f0);
                  if (!bVar1) {
                    testing::Message::Message(&local_300);
                    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2f0)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0x6fa,pcVar3);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_6.message_,&local_300);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_6.message_);
                    testing::Message::~Message(&local_300);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
                  local_320[1] = 0;
                  pXVar6 = sk_X509_NAME_value((stack_st_X509_NAME *)
                                              gtest_ar_1.message_._M_t.
                                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                              ._M_head_impl,1);
                  local_320[0] = X509_NAME_cmp((X509_NAME *)pXVar6,
                                               (X509_NAME *)
                                               gtest_ar.message_._M_t.
                                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               .
                                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                               ._M_head_impl);
                  testing::internal::EqHelper::Compare<int,_int,_nullptr>
                            ((EqHelper *)local_318,"0",
                             "X509_NAME_cmp(sk_X509_NAME_value(list, 1), name2)",local_320 + 1,
                             local_320);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_318);
                  if (!bVar1) {
                    testing::Message::Message(&local_328);
                    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_318)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0x6fb,pcVar3);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_7.message_,&local_328);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_7.message_);
                    testing::Message::~Message(&local_328);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_318);
                  local_348[1] = 0;
                  pXVar6 = sk_X509_NAME_value((stack_st_X509_NAME *)
                                              gtest_ar_1.message_._M_t.
                                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                              ._M_head_impl,2);
                  local_348[0] = X509_NAME_cmp((X509_NAME *)pXVar6,b);
                  testing::internal::EqHelper::Compare<int,_int,_nullptr>
                            ((EqHelper *)local_340,"0",
                             "X509_NAME_cmp(sk_X509_NAME_value(list, 2), name1)",local_348 + 1,
                             local_348);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_340);
                  if (!bVar1) {
                    testing::Message::Message(&local_350);
                    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_340)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              (&local_358,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0x6fc,pcVar3);
                    testing::internal::AssertHelper::operator=(&local_358,&local_350);
                    testing::internal::AssertHelper::~AssertHelper(&local_358);
                    testing::Message::~Message(&local_350);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_340);
                }
              }
            }
          }
        }
      }
      std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_);
      std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&cert2);
    }
    std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
  }
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(SSLTest, AddClientCA) {
  bssl::UniquePtr<SSL_CTX> ctx(SSL_CTX_new(TLS_method()));
  ASSERT_TRUE(ctx);
  bssl::UniquePtr<SSL> ssl(SSL_new(ctx.get()));
  ASSERT_TRUE(ssl);

  bssl::UniquePtr<X509> cert1 = GetTestCertificate();
  bssl::UniquePtr<X509> cert2 = GetChainTestCertificate();
  ASSERT_TRUE(cert1 && cert2);
  X509_NAME *name1 = X509_get_subject_name(cert1.get());
  X509_NAME *name2 = X509_get_subject_name(cert2.get());

  EXPECT_EQ(0u, sk_X509_NAME_num(SSL_get_client_CA_list(ssl.get())));

  ASSERT_TRUE(SSL_add_client_CA(ssl.get(), cert1.get()));
  ASSERT_TRUE(SSL_add_client_CA(ssl.get(), cert2.get()));

  STACK_OF(X509_NAME) *list = SSL_get_client_CA_list(ssl.get());
  ASSERT_EQ(2u, sk_X509_NAME_num(list));
  EXPECT_EQ(0, X509_NAME_cmp(sk_X509_NAME_value(list, 0), name1));
  EXPECT_EQ(0, X509_NAME_cmp(sk_X509_NAME_value(list, 1), name2));

  ASSERT_TRUE(SSL_add_client_CA(ssl.get(), cert1.get()));

  list = SSL_get_client_CA_list(ssl.get());
  ASSERT_EQ(3u, sk_X509_NAME_num(list));
  EXPECT_EQ(0, X509_NAME_cmp(sk_X509_NAME_value(list, 0), name1));
  EXPECT_EQ(0, X509_NAME_cmp(sk_X509_NAME_value(list, 1), name2));
  EXPECT_EQ(0, X509_NAME_cmp(sk_X509_NAME_value(list, 2), name1));
}